

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_convolve_sse2.c
# Opt level: O2

void av1_wiener_convolve_add_src_sse2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  short sVar1;
  uint uVar9;
  ushort *puVar10;
  undefined2 *puVar11;
  undefined2 *puVar12;
  undefined2 *puVar13;
  undefined2 *puVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  char cVar30;
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined4 uVar104;
  long lVar105;
  ulong uVar106;
  ulong uVar107;
  int iVar108;
  long lVar109;
  ulong uVar110;
  uint8_t *puVar111;
  undefined4 uVar115;
  undefined1 auVar112 [12];
  undefined4 uVar116;
  undefined1 auVar114 [16];
  undefined1 auVar117 [12];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 uVar137;
  undefined1 uVar138;
  undefined1 uVar139;
  undefined1 uVar140;
  undefined1 uVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [16];
  ushort auStack_8738 [16];
  undefined1 auStack_8718 [16];
  undefined1 auStack_8708 [16];
  undefined1 auStack_86f8 [16];
  undefined1 auStack_86e8 [16];
  undefined1 auStack_86d8 [16];
  undefined1 auStack_86c8 [144];
  undefined2 auStack_8638 [128];
  undefined1 auStack_8538 [256];
  undefined2 auStack_8438 [128];
  undefined1 auStack_8338 [256];
  undefined2 auStack_8238 [128];
  undefined1 auStack_8138 [256];
  undefined2 local_8038 [16388];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar113 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 uVar148;
  undefined1 uVar149;
  undefined1 uVar154;
  undefined1 uVar155;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 uVar163;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  
  uVar9 = h + 6;
  lVar105 = (long)(int)(uVar9 * 0x80);
  *(undefined1 (*) [16])(auStack_86c8 + lVar105 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86d8 + lVar105 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86e8 + lVar105 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86f8 + lVar105 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8708 + lVar105 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8718 + lVar105 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8738 + lVar105 + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8738 + lVar105) = (undefined1  [16])0x0;
  puVar111 = src + src_stride * -3 + -3;
  uVar104 = *(undefined4 *)filter_x;
  auVar117._0_8_ = CONCAT26(filter_x[3] + 0x80,*(undefined6 *)filter_x);
  auVar117._8_2_ = filter_x[4];
  auVar117._10_2_ = filter_x[5];
  auVar121._12_2_ = filter_x[6];
  auVar121._0_12_ = auVar117;
  auVar121._14_2_ = filter_x[7];
  uVar115 = (undefined4)((ulong)auVar117._0_8_ >> 0x20);
  uVar116 = auVar117._8_4_;
  auVar136._12_4_ = auVar121._12_4_;
  auVar119._4_4_ = uVar116;
  auVar119._0_4_ = uVar116;
  auVar119._8_4_ = uVar116;
  auVar119._12_4_ = uVar116;
  auVar136._4_4_ = auVar136._12_4_;
  auVar136._0_4_ = auVar136._12_4_;
  auVar136._8_4_ = auVar136._12_4_;
  cVar30 = (char)conv_params->round_0;
  iVar108 = (1 << (cVar30 - 1U & 0x1f)) + 0x4000;
  auVar121 = ZEXT416((uint)~(-1 << (0x10U - cVar30 & 0x1f)));
  auVar121 = pshuflw(auVar121,auVar121,0);
  uVar106 = 0;
  uVar110 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar110 = uVar106;
  }
  auVar123 = ZEXT416((uint)conv_params->round_0);
  for (; uVar106 != uVar110; uVar106 = uVar106 + 1) {
    for (lVar105 = 0; lVar105 < w; lVar105 = lVar105 + 8) {
      auVar142 = *(undefined1 (*) [16])(puVar111 + lVar105);
      uVar141 = auVar142[7];
      auVar21[0xd] = 0;
      auVar21._0_13_ = auVar142._0_13_;
      auVar21[0xe] = uVar141;
      uVar140 = auVar142[6];
      auVar31[0xc] = uVar140;
      auVar31._0_12_ = auVar142._0_12_;
      auVar31._13_2_ = auVar21._13_2_;
      auVar40[0xb] = 0;
      auVar40._0_11_ = auVar142._0_11_;
      auVar40._12_3_ = auVar31._12_3_;
      uVar139 = auVar142[5];
      auVar48[10] = uVar139;
      auVar48._0_10_ = auVar142._0_10_;
      auVar48._11_4_ = auVar40._11_4_;
      auVar56[9] = 0;
      auVar56._0_9_ = auVar142._0_9_;
      auVar56._10_5_ = auVar48._10_5_;
      uVar138 = auVar142[4];
      auVar64[8] = uVar138;
      auVar64._0_8_ = auVar142._0_8_;
      auVar64._9_6_ = auVar56._9_6_;
      auVar80._7_8_ = 0;
      auVar80._0_7_ = auVar64._8_7_;
      uVar137 = auVar142[3];
      auVar88._1_8_ = SUB158(auVar80 << 0x40,7);
      auVar88[0] = uVar137;
      auVar88._9_6_ = 0;
      auVar89._1_10_ = SUB1510(auVar88 << 0x30,5);
      auVar89[0] = auVar142[2];
      auVar89._11_4_ = 0;
      auVar72[2] = auVar142[1];
      auVar72._0_2_ = auVar142._0_2_;
      auVar72._3_12_ = SUB1512(auVar89 << 0x20,3);
      auVar168._0_2_ = auVar142._0_2_ & 0xff;
      auVar168._2_13_ = auVar72._2_13_;
      auVar168[0xf] = 0;
      auVar133._4_4_ = uVar104;
      auVar133._0_4_ = uVar104;
      auVar133._8_4_ = uVar104;
      auVar133._12_4_ = uVar104;
      auVar133 = pmaddwd(auVar168,auVar133);
      uVar149 = auVar142[9];
      auVar22[0xd] = 0;
      auVar22._0_13_ = auVar142._2_13_;
      auVar22[0xe] = uVar149;
      uVar148 = auVar142[8];
      auVar32[0xc] = uVar148;
      auVar32._0_12_ = auVar142._2_12_;
      auVar32._13_2_ = auVar22._13_2_;
      auVar41[0xb] = 0;
      auVar41._0_11_ = auVar142._2_11_;
      auVar41._12_3_ = auVar32._12_3_;
      auVar49[10] = uVar141;
      auVar49._0_10_ = auVar142._2_10_;
      auVar49._11_4_ = auVar41._11_4_;
      auVar57[9] = 0;
      auVar57._0_9_ = auVar142._2_9_;
      auVar57._10_5_ = auVar49._10_5_;
      auVar65[8] = uVar140;
      auVar65._0_8_ = auVar142._2_8_;
      auVar65._9_6_ = auVar57._9_6_;
      auVar81._7_8_ = 0;
      auVar81._0_7_ = auVar65._8_7_;
      auVar90._1_8_ = SUB158(auVar81 << 0x40,7);
      auVar90[0] = uVar139;
      auVar90._9_6_ = 0;
      auVar91._1_10_ = SUB1510(auVar90 << 0x30,5);
      auVar91[0] = uVar138;
      auVar91._11_4_ = 0;
      auVar73[2] = uVar137;
      auVar73._0_2_ = auVar142._2_2_;
      auVar73._3_12_ = SUB1512(auVar91 << 0x20,3);
      auVar144._0_2_ = auVar142._2_2_ & 0xff;
      auVar144._2_13_ = auVar73._2_13_;
      auVar144[0xf] = 0;
      auVar152._4_4_ = uVar115;
      auVar152._0_4_ = uVar115;
      auVar152._8_4_ = uVar115;
      auVar152._12_4_ = uVar115;
      auVar145 = pmaddwd(auVar144,auVar152);
      auVar150._0_12_ = auVar142._4_12_;
      auVar150._12_4_ = auVar142._12_4_;
      uVar155 = auVar142[0xb];
      auVar23[0xd] = 0;
      auVar23._0_13_ = auVar150._0_13_;
      auVar23[0xe] = uVar155;
      uVar154 = auVar142[10];
      auVar33[0xc] = uVar154;
      auVar33._0_12_ = auVar150._0_12_;
      auVar33._13_2_ = auVar23._13_2_;
      auVar42[0xb] = 0;
      auVar42._0_11_ = auVar142._4_11_;
      auVar42._12_3_ = auVar33._12_3_;
      auVar50[10] = uVar149;
      auVar50._0_10_ = auVar142._4_10_;
      auVar50._11_4_ = auVar42._11_4_;
      auVar58[9] = 0;
      auVar58._0_9_ = auVar142._4_9_;
      auVar58._10_5_ = auVar50._10_5_;
      auVar66[8] = uVar148;
      auVar66._0_8_ = auVar142._4_8_;
      auVar66._9_6_ = auVar58._9_6_;
      auVar82._7_8_ = 0;
      auVar82._0_7_ = auVar66._8_7_;
      auVar92._1_8_ = SUB158(auVar82 << 0x40,7);
      auVar92[0] = uVar141;
      auVar92._9_6_ = 0;
      auVar93._1_10_ = SUB1510(auVar92 << 0x30,5);
      auVar93[0] = uVar140;
      auVar93._11_4_ = 0;
      auVar74[2] = uVar139;
      auVar74._0_2_ = auVar142._4_2_;
      auVar74._3_12_ = SUB1512(auVar93 << 0x20,3);
      auVar151._0_2_ = auVar142._4_2_ & 0xff;
      auVar151._2_13_ = auVar74._2_13_;
      auVar151[0xf] = 0;
      auVar152 = pmaddwd(auVar151,auVar119);
      auVar24 = auVar142._3_13_;
      auVar25[0xd] = 0;
      auVar25._0_13_ = auVar24 >> 0x18;
      auVar25[0xe] = auVar142[0xd];
      uVar163 = auVar142[0xc];
      auVar35[0xc] = uVar163;
      auVar35._0_12_ = auVar150._0_12_ >> 0x10;
      auVar35._13_2_ = auVar25._13_2_;
      auVar34 = auVar142._5_11_;
      auVar43[0xb] = 0;
      auVar43._0_11_ = auVar34 >> 8;
      auVar43._12_3_ = auVar35._12_3_;
      auVar51[10] = uVar155;
      auVar51._0_10_ = auVar142._6_10_;
      auVar51._11_4_ = auVar43._11_4_;
      auVar59[9] = 0;
      auVar59._0_9_ = auVar142._6_9_;
      auVar59._10_5_ = auVar51._10_5_;
      auVar67[8] = uVar154;
      auVar67._0_8_ = auVar142._6_8_;
      auVar67._9_6_ = auVar59._9_6_;
      auVar83._7_8_ = 0;
      auVar83._0_7_ = auVar67._8_7_;
      auVar94._1_8_ = SUB158(auVar83 << 0x40,7);
      auVar94[0] = uVar149;
      auVar94._9_6_ = 0;
      auVar95._1_10_ = SUB1510(auVar94 << 0x30,5);
      auVar95[0] = uVar148;
      auVar95._11_4_ = 0;
      auVar75[2] = uVar141;
      auVar75._0_2_ = auVar142._6_2_;
      auVar75._3_12_ = SUB1512(auVar95 << 0x20,3);
      auVar156._0_2_ = auVar142._6_2_ & 0xff;
      auVar156._2_13_ = auVar75._2_13_;
      auVar156[0xf] = 0;
      auVar157 = pmaddwd(auVar156,auVar136);
      auVar134._0_4_ =
           auVar133._0_4_ + iVar108 + auVar145._0_4_ + auVar157._0_4_ + auVar152._0_4_ >> auVar123;
      auVar134._4_4_ =
           auVar133._4_4_ + iVar108 + auVar145._4_4_ + auVar157._4_4_ + auVar152._4_4_ >> auVar123;
      auVar134._8_4_ =
           auVar133._8_4_ + iVar108 + auVar145._8_4_ + auVar157._8_4_ + auVar152._8_4_ >> auVar123;
      auVar134._12_4_ =
           auVar133._12_4_ + iVar108 + auVar145._12_4_ + auVar157._12_4_ + auVar152._12_4_ >>
           auVar123;
      auVar26[0xd] = 0;
      auVar26._0_13_ = auVar142._1_13_;
      auVar26[0xe] = uVar148;
      auVar36[0xc] = uVar141;
      auVar36._0_12_ = auVar142._1_12_;
      auVar36._13_2_ = auVar26._13_2_;
      auVar44[0xb] = 0;
      auVar44._0_11_ = auVar142._1_11_;
      auVar44._12_3_ = auVar36._12_3_;
      auVar52[10] = uVar140;
      auVar52._0_10_ = auVar142._1_10_;
      auVar52._11_4_ = auVar44._11_4_;
      auVar60[9] = 0;
      auVar60._0_9_ = auVar142._1_9_;
      auVar60._10_5_ = auVar52._10_5_;
      auVar68[8] = uVar139;
      auVar68._0_8_ = auVar142._1_8_;
      auVar68._9_6_ = auVar60._9_6_;
      auVar84._7_8_ = 0;
      auVar84._0_7_ = auVar68._8_7_;
      auVar96._1_8_ = SUB158(auVar84 << 0x40,7);
      auVar96[0] = uVar138;
      auVar96._9_6_ = 0;
      auVar97._1_10_ = SUB1510(auVar96 << 0x30,5);
      auVar97[0] = uVar137;
      auVar97._11_4_ = 0;
      auVar76[2] = auVar142[2];
      auVar76._0_2_ = auVar142._1_2_;
      auVar76._3_12_ = SUB1512(auVar97 << 0x20,3);
      auVar146._0_2_ = auVar142._1_2_ & 0xff;
      auVar146._2_13_ = auVar76._2_13_;
      auVar146[0xf] = 0;
      auVar145._4_4_ = uVar104;
      auVar145._0_4_ = uVar104;
      auVar145._8_4_ = uVar104;
      auVar145._12_4_ = uVar104;
      auVar133 = pmaddwd(auVar146,auVar145);
      auVar27[0xd] = 0;
      auVar27._0_13_ = auVar24;
      auVar27[0xe] = uVar154;
      auVar37[0xc] = uVar149;
      auVar37._0_12_ = auVar142._3_12_;
      auVar37._13_2_ = auVar27._13_2_;
      auVar45[0xb] = 0;
      auVar45._0_11_ = auVar142._3_11_;
      auVar45._12_3_ = auVar37._12_3_;
      auVar53[10] = uVar148;
      auVar53._0_10_ = auVar142._3_10_;
      auVar53._11_4_ = auVar45._11_4_;
      auVar61[9] = 0;
      auVar61._0_9_ = auVar142._3_9_;
      auVar61._10_5_ = auVar53._10_5_;
      auVar69[8] = uVar141;
      auVar69._0_8_ = auVar142._3_8_;
      auVar69._9_6_ = auVar61._9_6_;
      auVar85._7_8_ = 0;
      auVar85._0_7_ = auVar69._8_7_;
      auVar98._1_8_ = SUB158(auVar85 << 0x40,7);
      auVar98[0] = uVar140;
      auVar98._9_6_ = 0;
      auVar99._1_10_ = SUB1510(auVar98 << 0x30,5);
      auVar99[0] = uVar139;
      auVar99._11_4_ = 0;
      auVar77[2] = uVar138;
      auVar77._0_2_ = auVar142._3_2_;
      auVar77._3_12_ = SUB1512(auVar99 << 0x20,3);
      auVar153._0_2_ = auVar142._3_2_ & 0xff;
      auVar153._2_13_ = auVar77._2_13_;
      auVar153[0xf] = 0;
      auVar157._4_4_ = uVar115;
      auVar157._0_4_ = uVar115;
      auVar157._8_4_ = uVar115;
      auVar157._12_4_ = uVar115;
      auVar145 = pmaddwd(auVar153,auVar157);
      auVar28[0xd] = 0;
      auVar28._0_13_ = auVar24 >> 0x10;
      auVar28[0xe] = uVar163;
      auVar38[0xc] = uVar155;
      auVar38._0_12_ = auVar150._0_12_ >> 8;
      auVar38._13_2_ = auVar28._13_2_;
      auVar46[0xb] = 0;
      auVar46._0_11_ = auVar34;
      auVar46._12_3_ = auVar38._12_3_;
      auVar54[10] = uVar154;
      auVar54._0_10_ = auVar142._5_10_;
      auVar54._11_4_ = auVar46._11_4_;
      auVar62[9] = 0;
      auVar62._0_9_ = auVar142._5_9_;
      auVar62._10_5_ = auVar54._10_5_;
      auVar70[8] = uVar149;
      auVar70._0_8_ = auVar142._5_8_;
      auVar70._9_6_ = auVar62._9_6_;
      auVar86._7_8_ = 0;
      auVar86._0_7_ = auVar70._8_7_;
      auVar100._1_8_ = SUB158(auVar86 << 0x40,7);
      auVar100[0] = uVar148;
      auVar100._9_6_ = 0;
      auVar101._1_10_ = SUB1510(auVar100 << 0x30,5);
      auVar101[0] = uVar141;
      auVar101._11_4_ = 0;
      auVar78[2] = uVar140;
      auVar78._0_2_ = auVar142._5_2_;
      auVar78._3_12_ = SUB1512(auVar101 << 0x20,3);
      auVar158._0_2_ = auVar142._5_2_ & 0xff;
      auVar158._2_13_ = auVar78._2_13_;
      auVar158[0xf] = 0;
      auVar152 = pmaddwd(auVar158,auVar119);
      auVar29[0xd] = 0;
      auVar29._0_13_ = auVar24 >> 0x20;
      auVar29[0xe] = auVar142[0xe];
      auVar39[0xc] = auVar142[0xd];
      auVar39._0_12_ = auVar150._0_12_ >> 0x18;
      auVar39._13_2_ = auVar29._13_2_;
      auVar47[0xb] = 0;
      auVar47._0_11_ = auVar34 >> 0x10;
      auVar47._12_3_ = auVar39._12_3_;
      auVar55[10] = uVar163;
      auVar55._0_10_ = auVar142._6_10_ >> 8;
      auVar55._11_4_ = auVar47._11_4_;
      auVar63[9] = 0;
      auVar63._0_9_ = auVar142._7_9_;
      auVar63._10_5_ = auVar55._10_5_;
      auVar71[8] = uVar155;
      auVar71._0_8_ = auVar142._7_8_;
      auVar71._9_6_ = auVar63._9_6_;
      auVar87._7_8_ = 0;
      auVar87._0_7_ = auVar71._8_7_;
      auVar102._1_8_ = SUB158(auVar87 << 0x40,7);
      auVar102[0] = uVar154;
      auVar102._9_6_ = 0;
      auVar103._1_10_ = SUB1510(auVar102 << 0x30,5);
      auVar103[0] = uVar149;
      auVar103._11_4_ = 0;
      auVar79[2] = uVar148;
      auVar79._0_2_ = auVar142._7_2_;
      auVar79._3_12_ = SUB1512(auVar103 << 0x20,3);
      auVar142._0_2_ = auVar142._7_2_ & 0xff;
      auVar142._2_13_ = auVar79._2_13_;
      auVar142[0xf] = 0;
      auVar142 = pmaddwd(auVar142,auVar136);
      auVar147._0_4_ =
           auVar133._0_4_ + iVar108 + auVar152._0_4_ + auVar145._0_4_ + auVar142._0_4_ >> auVar123;
      auVar147._4_4_ =
           auVar133._4_4_ + iVar108 + auVar152._4_4_ + auVar145._4_4_ + auVar142._4_4_ >> auVar123;
      auVar147._8_4_ =
           auVar133._8_4_ + iVar108 + auVar152._8_4_ + auVar145._8_4_ + auVar142._8_4_ >> auVar123;
      auVar147._12_4_ =
           auVar133._12_4_ + iVar108 + auVar152._12_4_ + auVar145._12_4_ + auVar142._12_4_ >>
           auVar123;
      auVar142 = packssdw(auVar134,auVar147);
      sVar1 = (ushort)(-1 < auVar142._0_2_) * auVar142._0_2_;
      sVar2 = (ushort)(-1 < auVar142._2_2_) * auVar142._2_2_;
      sVar3 = (ushort)(-1 < auVar142._4_2_) * auVar142._4_2_;
      sVar4 = (ushort)(-1 < auVar142._6_2_) * auVar142._6_2_;
      sVar5 = (ushort)(-1 < auVar142._8_2_) * auVar142._8_2_;
      sVar6 = (ushort)(-1 < auVar142._10_2_) * auVar142._10_2_;
      sVar7 = (ushort)(-1 < auVar142._12_2_) * auVar142._12_2_;
      sVar8 = (ushort)(-1 < auVar142._14_2_) * auVar142._14_2_;
      sVar15 = auVar121._0_2_;
      sVar16 = auVar121._2_2_;
      puVar10 = auStack_8738 + (ulong)((uint)uVar106 & 0x1ffffff) * 0x80 + lVar105;
      *puVar10 = (ushort)(sVar15 < sVar1) * sVar15 | (ushort)(sVar15 >= sVar1) * sVar1;
      puVar10[1] = (ushort)(sVar16 < sVar2) * sVar16 | (ushort)(sVar16 >= sVar2) * sVar2;
      puVar10[2] = (ushort)(sVar15 < sVar3) * sVar15 | (ushort)(sVar15 >= sVar3) * sVar3;
      puVar10[3] = (ushort)(sVar16 < sVar4) * sVar16 | (ushort)(sVar16 >= sVar4) * sVar4;
      puVar10[4] = (ushort)(sVar15 < sVar5) * sVar15 | (ushort)(sVar15 >= sVar5) * sVar5;
      puVar10[5] = (ushort)(sVar16 < sVar6) * sVar16 | (ushort)(sVar16 >= sVar6) * sVar6;
      puVar10[6] = (ushort)(sVar15 < sVar7) * sVar15 | (ushort)(sVar15 >= sVar7) * sVar7;
      puVar10[7] = (ushort)(sVar16 < sVar8) * sVar16 | (ushort)(sVar16 >= sVar8) * sVar8;
    }
    puVar111 = puVar111 + src_stride;
  }
  uVar104 = *(undefined4 *)filter_y;
  auVar112._0_8_ = CONCAT26(filter_y[3] + 0x80,*(undefined6 *)filter_y);
  auVar112._8_2_ = filter_y[4];
  auVar112._10_2_ = filter_y[5];
  auVar113._12_2_ = filter_y[6];
  auVar113._0_12_ = auVar112;
  auVar113._14_2_ = filter_y[7];
  uVar115 = (undefined4)((ulong)auVar112._0_8_ >> 0x20);
  uVar116 = auVar112._8_4_;
  auVar114._12_4_ = auVar113._12_4_;
  auVar123._4_4_ = uVar104;
  auVar123._0_4_ = uVar104;
  auVar123._8_4_ = uVar104;
  auVar123._12_4_ = uVar104;
  auVar114._4_4_ = auVar114._12_4_;
  auVar114._0_4_ = auVar114._12_4_;
  auVar114._8_4_ = auVar114._12_4_;
  cVar30 = (char)conv_params->round_1;
  iVar108 = (-1 << (cVar30 + 7U & 0x1f)) + (1 << (cVar30 - 1U & 0x1f));
  uVar106 = 0;
  uVar110 = (ulong)(uint)h;
  if (h < 1) {
    uVar110 = uVar106;
  }
  for (; uVar106 != uVar110; uVar106 = uVar106 + 1) {
    uVar107 = (ulong)((uint)uVar106 & 0x1ffffff);
    lVar105 = uVar107 * 0x100;
    for (lVar109 = 0; lVar109 < w; lVar109 = lVar109 + 8) {
      auVar119 = *(undefined1 (*) [16])(auStack_8738 + uVar107 * 0x80 + lVar109);
      puVar12 = auStack_8638 + uVar107 * 0x80 + lVar109;
      auVar121 = *(undefined1 (*) [16])(auStack_8538 + lVar109 * 2 + lVar105);
      auVar127._0_12_ = auVar119._0_12_;
      auVar127._12_2_ = auVar119._6_2_;
      auVar127._14_2_ = puVar12[3];
      auVar126._12_4_ = auVar127._12_4_;
      auVar126._0_10_ = auVar119._0_10_;
      auVar126._10_2_ = puVar12[2];
      auVar125._10_6_ = auVar126._10_6_;
      auVar125._0_8_ = auVar119._0_8_;
      auVar125._8_2_ = auVar119._4_2_;
      auVar124._8_8_ = auVar125._8_8_;
      auVar124._6_2_ = puVar12[1];
      auVar124._4_2_ = auVar119._2_2_;
      auVar124._0_2_ = auVar119._0_2_;
      auVar124._2_2_ = *puVar12;
      puVar13 = auStack_8438 + uVar107 * 0x80 + lVar109;
      auVar162._0_12_ = auVar121._0_12_;
      auVar162._12_2_ = auVar121._6_2_;
      auVar162._14_2_ = puVar13[3];
      auVar161._12_4_ = auVar162._12_4_;
      auVar161._0_10_ = auVar121._0_10_;
      auVar161._10_2_ = puVar13[2];
      auVar160._10_6_ = auVar161._10_6_;
      auVar160._0_8_ = auVar121._0_8_;
      auVar160._8_2_ = auVar121._4_2_;
      auVar159._8_8_ = auVar160._8_8_;
      auVar159._6_2_ = puVar13[1];
      auVar159._4_2_ = auVar121._2_2_;
      auVar159._0_2_ = auVar121._0_2_;
      auVar159._2_2_ = *puVar13;
      auVar136 = *(undefined1 (*) [16])(auStack_8338 + lVar109 * 2 + lVar105);
      puVar14 = auStack_8238 + uVar107 * 0x80 + lVar109;
      auVar167._0_12_ = auVar136._0_12_;
      auVar167._12_2_ = auVar136._6_2_;
      auVar167._14_2_ = puVar14[3];
      auVar166._12_4_ = auVar167._12_4_;
      auVar166._0_10_ = auVar136._0_10_;
      auVar166._10_2_ = puVar14[2];
      auVar165._10_6_ = auVar166._10_6_;
      auVar165._0_8_ = auVar136._0_8_;
      auVar165._8_2_ = auVar136._4_2_;
      auVar164._8_8_ = auVar165._8_8_;
      auVar164._6_2_ = puVar14[1];
      auVar164._4_2_ = auVar136._2_2_;
      auVar164._0_2_ = auVar136._0_2_;
      auVar164._2_2_ = *puVar14;
      auVar142 = *(undefined1 (*) [16])(auStack_8138 + lVar109 * 2 + lVar105);
      puVar11 = local_8038 + uVar107 * 0x80 + lVar109;
      auVar133 = pmaddwd(auVar124,auVar123);
      auVar17._4_4_ = uVar115;
      auVar17._0_4_ = uVar115;
      auVar17._8_4_ = uVar115;
      auVar17._12_4_ = uVar115;
      auVar157 = pmaddwd(auVar159,auVar17);
      auVar131._0_12_ = auVar142._0_12_;
      auVar131._12_2_ = auVar142._6_2_;
      auVar131._14_2_ = puVar11[3];
      auVar130._12_4_ = auVar131._12_4_;
      auVar130._0_10_ = auVar142._0_10_;
      auVar130._10_2_ = puVar11[2];
      auVar129._10_6_ = auVar130._10_6_;
      auVar129._0_8_ = auVar142._0_8_;
      auVar129._8_2_ = auVar142._4_2_;
      auVar128._8_8_ = auVar129._8_8_;
      auVar128._6_2_ = puVar11[1];
      auVar128._4_2_ = auVar142._2_2_;
      auVar128._0_2_ = auVar142._0_2_;
      auVar128._2_2_ = *puVar11;
      auVar19._4_4_ = uVar116;
      auVar19._0_4_ = uVar116;
      auVar19._8_4_ = uVar116;
      auVar19._12_4_ = uVar116;
      auVar168 = pmaddwd(auVar164,auVar19);
      auVar145 = pmaddwd(auVar128,auVar114);
      auVar135._2_2_ = puVar12[4];
      auVar135._0_2_ = auVar119._8_2_;
      auVar135._4_2_ = auVar119._10_2_;
      auVar135._6_2_ = puVar12[5];
      auVar135._8_2_ = auVar119._12_2_;
      auVar135._10_2_ = puVar12[6];
      auVar135._12_2_ = auVar119._14_2_;
      auVar135._14_2_ = puVar12[7];
      auVar118._2_2_ = puVar13[4];
      auVar118._0_2_ = auVar121._8_2_;
      auVar118._4_2_ = auVar121._10_2_;
      auVar118._6_2_ = puVar13[5];
      auVar118._8_2_ = auVar121._12_2_;
      auVar118._10_2_ = puVar13[6];
      auVar118._12_2_ = auVar121._14_2_;
      auVar118._14_2_ = puVar13[7];
      auVar143._2_2_ = puVar14[4];
      auVar143._0_2_ = auVar136._8_2_;
      auVar143._4_2_ = auVar136._10_2_;
      auVar143._6_2_ = puVar14[5];
      auVar143._8_2_ = auVar136._12_2_;
      auVar143._10_2_ = puVar14[6];
      auVar143._12_2_ = auVar136._14_2_;
      auVar143._14_2_ = puVar14[7];
      auVar122._2_2_ = puVar11[4];
      auVar122._0_2_ = auVar142._8_2_;
      auVar122._4_2_ = auVar142._10_2_;
      auVar122._6_2_ = puVar11[5];
      auVar122._8_2_ = auVar142._12_2_;
      auVar122._10_2_ = puVar11[6];
      auVar122._12_2_ = auVar142._14_2_;
      auVar122._14_2_ = puVar11[7];
      auVar136 = pmaddwd(auVar135,auVar123);
      auVar18._4_4_ = uVar115;
      auVar18._0_4_ = uVar115;
      auVar18._8_4_ = uVar115;
      auVar18._12_4_ = uVar115;
      auVar119 = pmaddwd(auVar118,auVar18);
      auVar20._4_4_ = uVar116;
      auVar20._0_4_ = uVar116;
      auVar20._8_4_ = uVar116;
      auVar20._12_4_ = uVar116;
      auVar152 = pmaddwd(auVar143,auVar20);
      auVar121 = pmaddwd(auVar122,auVar114);
      auVar142 = ZEXT416((uint)conv_params->round_1);
      auVar120._0_4_ =
           auVar145._0_4_ + auVar168._0_4_ + auVar157._0_4_ + auVar133._0_4_ + iVar108 >> auVar142;
      auVar120._4_4_ =
           auVar121._0_4_ + auVar152._0_4_ + auVar119._0_4_ + auVar136._0_4_ + iVar108 >> auVar142;
      auVar120._8_4_ =
           auVar145._4_4_ + auVar168._4_4_ + auVar157._4_4_ + auVar133._4_4_ + iVar108 >> auVar142;
      auVar120._12_4_ =
           auVar121._4_4_ + auVar152._4_4_ + auVar119._4_4_ + auVar136._4_4_ + iVar108 >> auVar142;
      auVar132._0_4_ =
           auVar145._8_4_ + auVar168._8_4_ + auVar157._8_4_ + auVar133._8_4_ + iVar108 >> auVar142;
      auVar132._4_4_ =
           auVar121._8_4_ + auVar152._8_4_ + auVar119._8_4_ + auVar136._8_4_ + iVar108 >> auVar142;
      auVar132._8_4_ =
           auVar145._12_4_ + auVar168._12_4_ + auVar157._12_4_ + auVar133._12_4_ + iVar108 >>
           auVar142;
      auVar132._12_4_ =
           auVar121._12_4_ + auVar152._12_4_ + auVar119._12_4_ + auVar136._12_4_ + iVar108 >>
           auVar142;
      auVar119 = packssdw(auVar120,auVar132);
      sVar2 = auVar119._0_2_;
      sVar3 = auVar119._2_2_;
      sVar4 = auVar119._4_2_;
      sVar5 = auVar119._6_2_;
      sVar6 = auVar119._8_2_;
      sVar7 = auVar119._10_2_;
      sVar8 = auVar119._12_2_;
      sVar1 = auVar119._14_2_;
      *(ulong *)(dst + lVar109) =
           CONCAT17((0 < sVar1) * (sVar1 < 0x100) * auVar119[0xe] - (0xff < sVar1),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar119[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar119[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar119[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar119[6]
                                                        - (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar119[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar119[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar119[0] -
                                                                          (0xff < sVar2))))))));
    }
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_sse2(const uint8_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const int16_t *filter_x, int x_step_q4,
                                      const int16_t *filter_y, int y_step_q4,
                                      int w, int h,
                                      const WienerConvolveParams *conv_params) {
  const int bd = 8;
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  (void)x_step_q4;
  (void)y_step_q4;

  DECLARE_ALIGNED(16, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 2;
  memset(temp + (intermediate_height * MAX_SB_SIZE), 0, MAX_SB_SIZE);
  int i, j;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint8_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero = _mm_setzero_si128();
  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero, 1 << FILTER_BITS, 3);

  /* Horizontal filter */
  {
    const __m128i coeffs_x =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_x), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (i = 0; i < intermediate_height; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

        // Filter even-index pixels
        const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i src_2 = _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i src_4 = _mm_unpacklo_epi8(_mm_srli_si128(data, 4), zero);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i src_6 = _mm_unpacklo_epi8(_mm_srli_si128(data, 6), zero);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even = _mm_srai_epi32(_mm_add_epi32(res_even, round_const),
                                  conv_params->round_0);

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i src_3 = _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i src_5 = _mm_unpacklo_epi8(_mm_srli_si128(data, 5), zero);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i src_7 = _mm_unpacklo_epi8(_mm_srli_si128(data, 7), zero);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd = _mm_srai_epi32(_mm_add_epi32(res_odd, round_const),
                                 conv_params->round_0);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        res = _mm_min_epi16(
            _mm_max_epi16(res, zero),
            _mm_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1));
        _mm_storeu_si128((__m128i *)&temp[i * MAX_SB_SIZE + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const __m128i coeffs_y =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_y), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const =
        _mm_set1_epi32((1 << (conv_params->round_1 - 1)) -
                       (1 << (bd + conv_params->round_1 - 1)));

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const uint16_t *data = &temp[i * MAX_SB_SIZE + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round = _mm_srai_epi32(
            _mm_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m128i res_hi_round = _mm_srai_epi32(
            _mm_add_epi32(res_hi, round_const), conv_params->round_1);

        const __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
        __m128i res_8bit = _mm_packus_epi16(res_16bit, res_16bit);

        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];
        _mm_storel_epi64(p, res_8bit);
      }
    }
  }
}